

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPSources::GetRTCPSourceData
          (RTPSources *this,uint32_t ssrc,RTPAddress *senderaddress,RTPInternalSourceData **srcdat2,
          bool *newsource)

{
  bool bVar1;
  int iVar2;
  RTPInternalSourceData *local_48;
  RTPInternalSourceData *srcdat;
  bool created;
  bool *pbStack_38;
  int status;
  bool *newsource_local;
  RTPInternalSourceData **srcdat2_local;
  RTPAddress *senderaddress_local;
  RTPSources *pRStack_18;
  uint32_t ssrc_local;
  RTPSources *this_local;
  
  *srcdat2 = (RTPInternalSourceData *)0x0;
  pbStack_38 = newsource;
  newsource_local = (bool *)srcdat2;
  srcdat2_local = (RTPInternalSourceData **)senderaddress;
  senderaddress_local._4_4_ = ssrc;
  pRStack_18 = this;
  srcdat._4_4_ = ObtainSourceDataInstance(this,ssrc,&local_48,(bool *)((long)&srcdat + 3));
  this_local._4_4_ = srcdat._4_4_;
  if (-1 < srcdat._4_4_) {
    if ((srcdat._3_1_ & 1) == 0) {
      bVar1 = CheckCollision(this,local_48,(RTPAddress *)srcdat2_local,false);
      if (bVar1) {
        return 0;
      }
    }
    else {
      iVar2 = RTPInternalSourceData::SetRTCPDataAddress(local_48,(RTPAddress *)srcdat2_local);
      if (iVar2 < 0) {
        return iVar2;
      }
    }
    *(RTPInternalSourceData **)newsource_local = local_48;
    *pbStack_38 = (bool)(srcdat._3_1_ & 1);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int RTPSources::GetRTCPSourceData(uint32_t ssrc,const RTPAddress *senderaddress,
		                  RTPInternalSourceData **srcdat2,bool *newsource)
{
	int status;
	bool created;
	RTPInternalSourceData *srcdat;
	
	*srcdat2 = 0;
	
	if ((status = ObtainSourceDataInstance(ssrc,&srcdat,&created)) < 0)
		return status;
	
	if (created)
	{
		if ((status = srcdat->SetRTCPDataAddress(senderaddress)) < 0)
			return status;
	}
	else // got a previously existing source
	{
		if (CheckCollision(srcdat,senderaddress,false))
			return 0; // ignore packet on collision
	}
	
	*srcdat2 = srcdat;
	*newsource = created;

	return 0;
}